

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::sample_col
          (SingleNodeColumnSampler<long_double,_float> *this,size_t *col_chosen,
          Xoshiro256PP *rnd_generator)

{
  ulong *puVar1;
  pointer puVar2;
  unsigned_long uVar3;
  _Bit_type *p_Var4;
  size_t sVar5;
  byte bVar6;
  result_type rVar7;
  double *pdVar8;
  runtime_error *this_00;
  ulong uVar9;
  size_t *psVar10;
  size_t sVar11;
  Xoshiro256PP *__urng;
  size_t sVar12;
  result_type rVar13;
  ulong uVar14;
  _Adaptor<Xoshiro::Xoshiro256PP,_double> __aurng;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  double dVar17;
  double dVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->using_tree == false) {
    if (this->backup_weights == true) {
      this->weights_orig =
           (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    __urng = (Xoshiro256PP *)col_chosen;
    if (this->n_inf != 0) {
      local_110._M_string_length = this->n_inf - 1;
      local_110._M_dataplus._M_p = (pointer)0x0;
      __urng = rnd_generator;
      rVar7 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&local_110,rnd_generator,
                         (param_type *)&local_110);
      if (this->curr_pos != 0) {
        __urng = (Xoshiro256PP *)0x8000000000000000;
        p_Var4 = (this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        rVar13 = 0;
        sVar11 = 0;
        do {
          uVar9 = this->col_indices[sVar11];
          uVar14 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar14 = uVar9;
          }
          rVar13 = rVar13 + ((p_Var4[((long)uVar14 >> 6) +
                                     (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                                     0xffffffffffffffff] >> (uVar9 & 0x3f) & 1) != 0);
          if (rVar13 == rVar7) {
            *col_chosen = uVar9;
            this->n_inf = this->n_inf - 1;
            uVar9 = *col_chosen;
            uVar14 = uVar9 + 0x3f;
            if (-1 < (long)uVar9) {
              uVar14 = uVar9;
            }
            bVar6 = (byte)uVar9 & 0x3f;
            puVar1 = p_Var4 + ((long)uVar14 >> 6) +
                              (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                              0xffffffffffffffff;
            *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
            goto LAB_00286ee8;
          }
          sVar11 = sVar11 + 1;
        } while (this->curr_pos != sVar11);
      }
    }
    if (this->n_left == 0) {
      return false;
    }
    lVar15 = (longdouble)0;
    lVar16 = this->cumw;
    if (this->cumw <= lVar15) {
      this->cumw = lVar15;
      if ((Xoshiro256PP *)this->curr_pos == (Xoshiro256PP *)0x0) {
LAB_00286f00:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"Unexpected error in ","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/utils.hpp"
                   ,"");
        std::operator+(&local_90,&local_150,&local_d0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,":","");
        std::operator+(&local_70,&local_90,&local_f0);
        std::__cxx11::to_string(&local_b0,0x4c0);
        std::operator+(&local_50,&local_70,&local_b0);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,"");
        std::operator+(&local_110,&local_50,&local_130);
        std::runtime_error::runtime_error(this_00,(string *)&local_110);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __urng = (Xoshiro256PP *)0x0;
      do {
        lVar15 = lVar15 + (longdouble)this->weights_orig[this->col_indices[(long)__urng]];
        __urng = (Xoshiro256PP *)((long)__urng->state + 1);
      } while ((Xoshiro256PP *)this->curr_pos != __urng);
      this->cumw = lVar15;
      lVar16 = lVar15;
      if (lVar15 <= (longdouble)0) goto LAB_00286f00;
    }
    std::generate_canonical<long_double,64ul,Xoshiro::Xoshiro256PP>
              ((longdouble *)rnd_generator,__urng);
    lVar15 = (longdouble)0;
    lVar16 = lVar16 * in_ST0 + lVar15;
    sVar11 = this->curr_pos;
    if (sVar11 == 0) {
      pdVar8 = this->weights_orig;
      psVar10 = this->col_indices;
    }
    else {
      pdVar8 = this->weights_orig;
      psVar10 = this->col_indices;
      sVar12 = 0;
      do {
        sVar5 = psVar10[sVar12];
        dVar18 = pdVar8[sVar5];
        lVar15 = lVar15 + (longdouble)dVar18;
        if (lVar16 <= lVar15) {
          *col_chosen = sVar5;
          this->cumw = this->cumw - (longdouble)dVar18;
          pdVar8[sVar5] = 0.0;
          goto LAB_00286ee8;
        }
        sVar12 = sVar12 + 1;
      } while (sVar11 != sVar12);
    }
    sVar11 = psVar10[sVar11 - 1];
    *col_chosen = sVar11;
    this->cumw = this->cumw - (longdouble)pdVar8[sVar11];
    pdVar8[sVar11] = 0.0;
  }
  else {
    if (this->n_inf == 0) {
      if (this->n_left != 0) {
        pdVar8 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar18 = *pdVar8;
        if (0.0 < dVar18) {
          if (this->tree_levels == 0) {
            uVar9 = 0;
          }
          else {
            uVar14 = 0;
            uVar9 = 0;
            do {
              dVar17 = std::generate_canonical<double,53ul,Xoshiro::Xoshiro256PP>(rnd_generator);
              pdVar8 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar9 = (uVar9 * 2 + 2) - (ulong)(dVar17 * dVar18 + 0.0 < pdVar8[uVar9 * 2 + 1]);
              dVar18 = pdVar8[uVar9];
              uVar14 = uVar14 + 1;
            } while (uVar14 < this->tree_levels);
          }
          *col_chosen = (this->mapped_indices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9 - this->offset];
          pdVar8[uVar9] = 0.0;
          for (sVar11 = this->tree_levels; sVar11 != 0; sVar11 = sVar11 - 1) {
            uVar14 = uVar9 * 8 - 8 | 8;
            uVar9 = uVar9 - 1 >> 1;
            pdVar8[uVar9] =
                 *(double *)((long)pdVar8 + uVar14) + *(double *)((long)pdVar8 + uVar14 + 8);
          }
          goto LAB_00286ee8;
        }
      }
      return false;
    }
    local_110._M_string_length = this->n_inf - 1;
    local_110._M_dataplus._M_p = (pointer)0x0;
    rVar7 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_110,rnd_generator,
                       (param_type *)&local_110);
    puVar2 = (this->mapped_inf_indices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *col_chosen = puVar2[rVar7];
    sVar11 = this->n_inf;
    this->n_inf = sVar11 - 1;
    uVar3 = puVar2[rVar7];
    puVar2[rVar7] = puVar2[sVar11 - 1];
    puVar2[sVar11 - 1] = uVar3;
  }
LAB_00286ee8:
  this->n_left = this->n_left - 1;
  return true;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::sample_col(size_t &col_chosen, RNG_engine &rnd_generator)
{
    if (!this->using_tree)
    {
        if (this->backup_weights)
            this->weights_orig = this->weights_own.data();

        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            size_t curr = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                curr += inifinite_weights[this->col_indices[col]];
                if (curr == chosen)
                {
                    col_chosen = this->col_indices[col];
                    this->n_inf--;
                    this->inifinite_weights[col_chosen] = false;
                    this->n_left--;
                    return true;
                }
            }
            assert(0);
        }

        if (!this->n_left) return false;

        /* due to the way this is calculated, there can be large roundoff errors and even negatives */
        if (this->cumw <= 0)
        {
            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
                this->cumw += this->weights_orig[this->col_indices[col]];
            if (unlikely(this->cumw <= 0))
                unexpected_error();
        }

        /* if there are no infinites, choose a column according to weight */
        ldouble_safe chosen = std::uniform_real_distribution<ldouble_safe>((ldouble_safe)0, this->cumw)(rnd_generator);
        ldouble_safe cumw_ = 0;
        for (size_t col = 0; col < this->curr_pos; col++)
        {
            cumw_ += this->weights_orig[this->col_indices[col]];
            if (cumw_ >= chosen)
            {
                col_chosen = this->col_indices[col];
                this->cumw -= this->weights_orig[col_chosen];
                this->weights_orig[col_chosen] = 0;
                this->n_left--;
                return true;
            }
        }
        col_chosen = this->col_indices[this->curr_pos-1];
        this->cumw -= this->weights_orig[col_chosen];
        this->weights_orig[col_chosen] = 0;
        this->n_left--;
        return true;
    }

    else
    {
        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            col_chosen = this->mapped_inf_indices[chosen];
            std::swap(this->mapped_inf_indices[chosen], this->mapped_inf_indices[--this->n_inf]);
            this->n_left--;
            return true;
        }

        else
        {
            /* TODO: should standardize all these tree traversals into one.
               This one in particular could do with sampling only a single
               random number as it will not typically require exhausting all
               options like the usual column sampler. */
            if (!this->n_left) return false;
            size_t curr_ix = 0;
            double rnd_subrange, w_left;
            double curr_subrange = this->tree_weights[0];
            if (curr_subrange <= 0)
                return false;

            for (size_t lev = 0; lev < tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = this->tree_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = this->tree_weights[curr_ix];
            }

            col_chosen = this->mapped_indices[curr_ix - this->offset];

            this->tree_weights[curr_ix] = 0.;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                this->tree_weights[curr_ix] =   this->tree_weights[ix_child(curr_ix)]
                                              + this->tree_weights[ix_child(curr_ix) + 1];
            }
            
            this->n_left--;
            return true;
        }
    }
}